

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

AST * __thiscall jsonnet::internal::anon_unknown_0::Interpreter::decodeUTF8(Interpreter *this)

{
  uint uVar1;
  size_type sVar2;
  const_reference ppHVar3;
  ostream *poVar4;
  undefined8 uVar5;
  long in_RDI;
  Value VVar6;
  stringstream ss_1;
  double d;
  stringstream ss;
  Value b;
  HeapThunk *th;
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  *elements;
  Frame *f;
  string *in_stack_fffffffffffffbb8;
  UString *v;
  Interpreter *in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbcc;
  string *in_stack_fffffffffffffbf8;
  UString local_3e0;
  Type local_3c0;
  undefined4 uStack_3bc;
  anon_union_8_3_4e909c26_for_v local_3b8;
  undefined1 local_3a9;
  stringstream local_388 [16];
  BindingFrame *in_stack_fffffffffffffc88;
  uint in_stack_fffffffffffffc94;
  HeapObject *in_stack_fffffffffffffc98;
  HeapEntity *in_stack_fffffffffffffca0;
  LocationRange *in_stack_fffffffffffffca8;
  Stack *in_stack_fffffffffffffcb0;
  stringstream local_1c0 [16];
  ostream local_1b0 [376];
  undefined8 local_38;
  double local_30;
  value_type local_28;
  HeapEntity *local_20;
  Frame *local_18;
  
  local_18 = Stack::top((Stack *)0x241465);
  local_20 = (local_18->val).v.h + 1;
  while( true ) {
    uVar1 = local_18->elementId;
    sVar2 = std::
            vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
            ::size((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                    *)local_20);
    if (sVar2 <= uVar1) {
      v = &local_3e0;
      decode_utf8(in_stack_fffffffffffffbf8);
      VVar6 = makeString(in_stack_fffffffffffffbc0,v);
      local_3b8 = VVar6.v;
      local_3c0 = VVar6.t;
      *(ulong *)(in_RDI + 0x40) = CONCAT44(uStack_3bc,local_3c0);
      ((anon_union_8_3_4e909c26_for_v *)(in_RDI + 0x48))->h = (HeapEntity *)local_3b8;
      std::__cxx11::u32string::~u32string
                ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                 local_3b8.h);
      return (AST *)0x0;
    }
    ppHVar3 = std::
              vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
              ::operator[]((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                            *)local_20,(ulong)local_18->elementId);
    local_28 = *ppHVar3;
    if (((local_28->super_HeapEntity).field_0xa & 1) == 0) {
      Stack::newCall(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,
                     in_stack_fffffffffffffc98,in_stack_fffffffffffffc94,in_stack_fffffffffffffc88);
      return local_28->body;
    }
    local_38 = *(undefined8 *)&local_28->content;
    local_30 = (local_28->content).v.d;
    if ((int)local_38 != 2) {
      std::__cxx11::stringstream::stringstream(local_1c0);
      poVar4 = std::operator<<(local_1b0,"Element ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_18->elementId);
      std::operator<<(poVar4," of the provided array was not a number");
      uVar5 = __cxa_allocate_exception(0x38);
      Stack::top((Stack *)0x24159d);
      std::__cxx11::stringstream::str();
      makeError((Interpreter *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                (LocationRange *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
      __cxa_throw(uVar5,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
    }
    if ((((local_30 < 0.0) || (255.0 < local_30)) || (local_30 != (double)(int)local_30)) ||
       (NAN(local_30) || NAN((double)(int)local_30))) break;
    std::__cxx11::string::push_back((char)local_18 + '(');
    local_18->elementId = local_18->elementId + 1;
  }
  std::__cxx11::stringstream::stringstream(local_388);
  poVar4 = std::operator<<((ostream *)&stack0xfffffffffffffc88,"Element ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_18->elementId);
  std::operator<<(poVar4," of the provided array was not an integer in range [0,255]");
  local_3a9 = 1;
  uVar5 = __cxa_allocate_exception(0x38);
  Stack::top((Stack *)0x241750);
  std::__cxx11::stringstream::str();
  makeError((Interpreter *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
            (LocationRange *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  local_3a9 = 0;
  __cxa_throw(uVar5,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
}

Assistant:

const AST *decodeUTF8(void)
    {
        Frame &f = stack.top();
        const auto& elements = static_cast<HeapArray*>(f.val.v.h)->elements;
        while (f.elementId < elements.size()) {
            auto *th = elements[f.elementId];
            if (th->filled) {
                auto b = th->content;
                if (b.t != Value::NUMBER) {
                    std::stringstream ss;
                    ss << "Element " << f.elementId << " of the provided array was not a number";
                    throw makeError(stack.top().location, ss.str());
                } else {
                    double d = b.v.d;
                    if (d < 0 || d > 255 || d != int(d)) {
                        std::stringstream ss;
                        ss << "Element " << f.elementId << " of the provided array was not an integer in range [0,255]";
                        throw makeError(stack.top().location, ss.str());
                    }
                    f.bytes.push_back(uint8_t(d));
                }
                f.elementId++;
            } else {
                stack.newCall(f.location, th, th->self, th->offset, th->upValues);
                return th->body;
            }
        }
        scratch = makeString(decode_utf8(f.bytes));
        return nullptr;
    }